

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop_repository_basis.cpp
# Opt level: O2

coop_t * __thiscall
so_5::impl::coop_repository_basis_t::find_parent_coop_if_necessary
          (coop_repository_basis_t *this,coop_t *coop_to_be_registered)

{
  bool bVar1;
  string *psVar2;
  const_iterator cVar3;
  coop_t *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = coop_t::has_parent_coop(coop_to_be_registered);
  if (bVar1) {
    psVar2 = coop_t::parent_coop_name_abi_cxx11_(coop_to_be_registered);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::coop_t>_>_>_>
            ::find(&(this->m_registered_coop)._M_t,psVar2);
    if (&(this->m_registered_coop)._M_t._M_impl.super__Rb_tree_header ==
        (_Rb_tree_header *)cVar3._M_node) {
      psVar2 = coop_t::parent_coop_name_abi_cxx11_(coop_to_be_registered);
      std::operator+(&local_38,"parent coop with name \"",psVar2);
      std::operator+(&bStack_58,&local_38,"\" is not registered");
      exception_t::raise(0x28381e);
      std::__cxx11::string::~string((string *)&bStack_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
    pcVar4 = *(coop_t **)(cVar3._M_node + 2);
  }
  else {
    pcVar4 = (coop_t *)0x0;
  }
  return pcVar4;
}

Assistant:

coop_t *
coop_repository_basis_t::find_parent_coop_if_necessary(
	const coop_t & coop_to_be_registered ) const
{
	if( coop_to_be_registered.has_parent_coop() )
	{
		auto it = m_registered_coop.find(
				coop_to_be_registered.parent_coop_name() );
		if( m_registered_coop.end() == it )
		{
			SO_5_THROW_EXCEPTION(
				rc_parent_coop_not_found,
				"parent coop with name \"" +
					coop_to_be_registered.parent_coop_name() +
					"\" is not registered" );
		}

		return it->second.get();
	}

	return nullptr;
}